

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::translateActiveException(void)

{
  bool bVar1;
  uint uVar2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *this;
  reference ppIVar3;
  ContextOptions *pCVar4;
  undefined7 uVar5;
  String *in_RDI;
  AssertData *ad;
  byte bStack_1b2;
  byte bStack_1b1;
  bool bStack_179;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  _Stack_168;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  _Stack_160;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *pvStack_158;
  String SStack_150;
  String SStack_138;
  String SStack_120;
  String SStack_108;
  String SStack_f0;
  byte bStack_c1;
  String SStack_c0;
  AssertData *pAStack_a8;
  undefined1 *puStack_a0;
  undefined1 local_89;
  String *local_88;
  String *local_80;
  exception *ex;
  string *msg;
  char *msg_1;
  reference local_50;
  IExceptionTranslator **curr;
  iterator __end2;
  iterator __begin2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *__range2;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *translators;
  String res;
  
  puStack_a0 = (undefined1 *)0x10e133;
  local_88 = in_RDI;
  local_80 = in_RDI;
  String::String((String *)&translators);
  puStack_a0 = (undefined1 *)0x10e138;
  this = getExceptionTranslators();
  puStack_a0 = (undefined1 *)0x10e14d;
  __end2 = std::
           vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
           ::begin(this);
  puStack_a0 = (undefined1 *)0x10e15a;
  curr = (IExceptionTranslator **)
         std::
         vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
         ::end(this);
  while( true ) {
    ad = (AssertData *)&__end2;
    puStack_a0 = (undefined1 *)0x10e16b;
    bVar1 = __gnu_cxx::
            operator==<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                      ((__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                        *)ad,(__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                              *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      puStack_a0 = (undefined1 *)0x10e1e9;
      __cxa_rethrow();
      pAStack_a8 = ad;
      if ((ad->m_at & is_throws) == 0) {
        if (((ad->m_at & is_throws_as) == 0) || ((ad->m_at & is_throws_with) == 0)) {
          if ((ad->m_at & is_throws_as) == 0) {
            if ((ad->m_at & is_throws_with) == 0) {
              puStack_a0 = &stack0xfffffffffffffff8;
              if ((ad->m_at & is_nothrow) != 0) {
                puStack_a0 = &stack0xfffffffffffffff8;
                ad->m_failed = (bool)(ad->m_threw & 1);
              }
            }
            else {
              puStack_a0 = &stack0xfffffffffffffff8;
              String::String(&SStack_f0,ad->m_exception_string);
              bVar1 = operator!=(&ad->m_exception,&SStack_f0);
              ad->m_failed = bVar1;
              String::~String(&SStack_f0);
            }
          }
          else {
            puStack_a0 = &stack0xfffffffffffffff8;
            ad->m_failed = (bool)((ad->m_threw_as ^ 0xffU) & 1);
          }
        }
        else {
          bStack_c1 = 0;
          bStack_179 = true;
          puStack_a0 = &stack0xfffffffffffffff8;
          if ((ad->m_threw_as & 1U) != 0) {
            puStack_a0 = &stack0xfffffffffffffff8;
            String::String(&SStack_c0,ad->m_exception_string);
            bStack_c1 = 1;
            bStack_179 = operator!=(&ad->m_exception,&SStack_c0);
          }
          ad->m_failed = bStack_179;
          if ((bStack_c1 & 1) != 0) {
            String::~String(&SStack_c0);
          }
        }
      }
      else {
        puStack_a0 = &stack0xfffffffffffffff8;
        ad->m_failed = (bool)((ad->m_threw ^ 0xffU) & 1);
      }
      uVar2 = String::size(&ad->m_exception);
      if (uVar2 != 0) {
        String::String(&SStack_138,"\"");
        operator+(&SStack_120,&SStack_138,&ad->m_exception);
        String::String(&SStack_150,"\"");
        operator+(&SStack_108,&SStack_120,&SStack_150);
        String::operator=(&ad->m_exception,&SStack_108);
        String::~String(&SStack_108);
        String::~String(&SStack_150);
        String::~String(&SStack_120);
        String::~String(&SStack_138);
      }
      if ((is_running_in_test & 1) == 0) {
        if ((ad->m_failed & 1U) != 0) {
          detail::failed_out_of_a_testing_context(ad);
        }
      }
      else {
        addAssert(ad->m_at);
        pvStack_158 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                      (detail::g_cs + 0x10d0);
        _Stack_160._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                       (pvStack_158);
        _Stack_168._M_current =
             (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                       (pvStack_158);
        while (bVar1 = __gnu_cxx::
                       operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 (&_Stack_160,&_Stack_168), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppIVar3 = __gnu_cxx::
                    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                    ::operator*(&_Stack_160);
          (*(*ppIVar3)->_vptr_IReporter[9])(*ppIVar3,ad);
          __gnu_cxx::
          __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
          ::operator++(&_Stack_160);
        }
        if ((ad->m_failed & 1U) != 0) {
          addFailedAssert(ad->m_at);
        }
      }
      uVar5 = 0;
      bStack_1b1 = 0;
      if ((ad->m_failed & 1U) != 0) {
        bVar1 = detail::isDebuggerActive();
        uVar5 = 0;
        bStack_1b1 = 0;
        if (bVar1) {
          pCVar4 = getContextOptions();
          uVar5 = 0;
          bStack_1b1 = 0;
          if ((pCVar4->no_breaks & 1U) == 0) {
            uVar5 = 0;
            bStack_1b2 = 1;
            if (*(long *)(detail::g_cs + 0x20) != 0) {
              uVar5 = (undefined7)((ulong)*(long *)(detail::g_cs + 0x20) >> 8);
              bStack_1b2 = *(byte *)(*(long *)(detail::g_cs + 0x20) + 0x39) ^ 0xff;
            }
            bStack_1b1 = bStack_1b2;
          }
        }
      }
      return (String *)(CONCAT71(uVar5,bStack_1b1) & 0xffffffffffffff01);
    }
    puStack_a0 = (undefined1 *)0x10e17c;
    local_50 = __gnu_cxx::
               __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
               ::operator*(&__end2);
    puStack_a0 = (undefined1 *)0x10e194;
    uVar2 = (*(*local_50)->_vptr_IExceptionTranslator[2])(*local_50,&translators);
    local_89 = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) break;
    puStack_a0 = (undefined1 *)0x10e1df;
    __gnu_cxx::
    __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
    ::operator++(&__end2);
  }
  puStack_a0 = (undefined1 *)0x10e1b5;
  String::String(local_88,(String *)&translators);
  msg_1._0_4_ = 1;
  puStack_a0 = (undefined1 *)0x10e34f;
  String::~String((String *)&translators);
  return local_80;
}

Assistant:

String translateActiveException() {
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        String res;
        auto&  translators = getExceptionTranslators();
        for(auto& curr : translators)
            if(curr->translate(res))
                return res;
        // clang-format off
        DOCTEST_GCC_SUPPRESS_WARNING_WITH_PUSH("-Wcatch-value")
        try {
            throw;
        } catch(std::exception& ex) {
            return ex.what();
        } catch(std::string& msg) {
            return msg.c_str();
        } catch(const char* msg) {
            return msg;
        } catch(...) {
            return "unknown exception";
        }
        DOCTEST_GCC_SUPPRESS_WARNING_POP
// clang-format on
#else  // DOCTEST_CONFIG_NO_EXCEPTIONS
        return "";
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
    }